

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveXML.h
# Opt level: O0

void __thiscall
chrono::ChArchiveInXML::ChArchiveInXML(ChArchiveInXML *this,ChStreamInAsciiFile *mistream)

{
  fstream *__s;
  reference text;
  xml_node<char> *pxVar1;
  ChExceptionArchive *this_00;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  value_type local_18b [2];
  allocator local_189;
  string local_188 [8];
  string line;
  parse_error *merror;
  undefined1 local_48 [12];
  undefined1 local_38 [2] [12];
  ChStreamInAsciiFile *local_18;
  ChStreamInAsciiFile *mistream_local;
  ChArchiveInXML *this_local;
  
  local_18 = mistream;
  mistream_local = (ChStreamInAsciiFile *)this;
  ChArchiveIn::ChArchiveIn(&this->super_ChArchiveIn);
  (this->super_ChArchiveIn).super_ChArchive._vptr_ChArchive =
       (_func_int **)&PTR__ChArchiveInXML_001d7540;
  rapidxml::xml_document<char>::xml_document(&this->document);
  std::
  stack<rapidxml::xml_node<char>*,std::deque<rapidxml::xml_node<char>*,std::allocator<rapidxml::xml_node<char>*>>>
  ::stack<std::deque<rapidxml::xml_node<char>*,std::allocator<rapidxml::xml_node<char>*>>,void>
            ((stack<rapidxml::xml_node<char>*,std::deque<rapidxml::xml_node<char>*,std::allocator<rapidxml::xml_node<char>*>>>
              *)&this->levels);
  std::stack<bool,std::deque<bool,std::allocator<bool>>>::
  stack<std::deque<bool,std::allocator<bool>>,void>
            ((stack<bool,std::deque<bool,std::allocator<bool>>> *)&this->is_array);
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)&this->array_index);
  std::vector<char,_std::allocator<char>_>::vector(&this->buffer);
  this->istream = local_18;
  __s = ChStreamFile::GetFstream((ChStreamFile *)this->istream);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_38,(istream_type *)__s);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_48);
  __first._12_4_ = 0;
  __first._M_sbuf = (streambuf_type *)local_38[0]._0_8_;
  __first._M_c = local_38[0]._8_4_;
  __last._12_4_ = 0;
  __last._M_sbuf = (streambuf_type *)local_48._0_8_;
  __last._M_c = local_48._8_4_;
  std::vector<char,std::allocator<char>>::
  assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<char,std::allocator<char>> *)&this->buffer,__first,__last);
  merror._7_1_ = 0;
  std::vector<char,_std::allocator<char>_>::push_back
            (&this->buffer,(value_type *)((long)&merror + 7));
  text = std::vector<char,_std::allocator<char>_>::operator[](&this->buffer,0);
  rapidxml::xml_document<char>::parse<0>(&this->document,text);
  pxVar1 = rapidxml::xml_node<char>::first_node
                     (&(this->document).super_xml_node<char>,(char *)0x0,0,true);
  if (pxVar1 == (xml_node<char> *)0x0) {
    local_18b[1] = true;
    this_00 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_188,"The file is not a valid XML document",&local_189);
    ChExceptionArchive::ChExceptionArchive(this_00,local_188);
    local_18b[1] = false;
    __cxa_throw(this_00,&ChExceptionArchive::typeinfo,ChExceptionArchive::~ChExceptionArchive);
  }
  this->level = &(this->document).super_xml_node<char>;
  std::
  stack<rapidxml::xml_node<char>_*,_std::deque<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_>_>
  ::push(&this->levels,&this->level);
  local_18b[0] = false;
  std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::push(&this->is_array,local_18b);
  this->tolerate_missing_tokens = false;
  return;
}

Assistant:

ChArchiveInXML( ChStreamInAsciiFile& mistream) {
            istream = &mistream;

			buffer.assign((std::istreambuf_iterator<char>(istream->GetFstream())), std::istreambuf_iterator<char>());
			buffer.push_back('\0');

			try {
				document.parse<0>(&buffer[0]);
			}
			catch (const rapidxml::parse_error &merror) {
				std::string line(merror.where<char>());
				line.erase(std::find_if(line.begin(), line.end(), [](int c) {return (c==*"\n");}), line.end());
				throw ChExceptionArchive(std::string("XML parsing error: ") + merror.what() + " at: \n" + line + "\n");
			}

			if (!document.first_node())
				throw (ChExceptionArchive("The file is not a valid XML document"));

			level = &document;//.first_node();
            levels.push(level);
            is_array.push(false);

            tolerate_missing_tokens = false;
      }